

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_plats.cpp
# Opt level: O1

void __thiscall DPlat::Serialize(DPlat *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  type val;
  type val_1;
  type val_2;
  EPlatType local_24;
  EPlatState local_20;
  EPlatState local_1c;
  
  DMover::Serialize((DMover *)this,arc);
  local_24 = this->m_Type;
  ::Serialize(arc,"type",&local_24,(uint32_t *)0x0);
  this->m_Type = local_24;
  pFVar1 = ::Serialize(arc,"speed",&this->m_Speed,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"low",&this->m_Low,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"high",&this->m_High,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"wait",&this->m_Wait,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"count",&this->m_Count,(int32_t *)0x0);
  local_20 = this->m_Status;
  ::Serialize(pFVar1,"status",&local_20,(uint32_t *)0x0);
  this->m_Status = local_20;
  local_1c = this->m_OldStatus;
  ::Serialize(pFVar1,"oldstatus",&local_1c,(uint32_t *)0x0);
  this->m_OldStatus = local_1c;
  pFVar1 = ::Serialize(pFVar1,"crush",&this->m_Crush,(int32_t *)0x0);
  ::Serialize(pFVar1,"tag",&this->m_Tag,(int32_t *)0x0);
  return;
}

Assistant:

void DPlat::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc.Enum("type", m_Type)
		("speed", m_Speed)
		("low", m_Low)
		("high", m_High)
		("wait", m_Wait)
		("count", m_Count)
		.Enum("status", m_Status)
		.Enum("oldstatus", m_OldStatus)
		("crush", m_Crush)
		("tag", m_Tag);
}